

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void testStructuredErrorHandler(void *ctx,xmlErrorPtr err)

{
  uint uVar1;
  int iVar2;
  xmlErrorLevel xVar3;
  void *pvVar4;
  char *pcVar5;
  xmlParserCtxtPtr pxVar6;
  int iVar7;
  int iVar8;
  int local_11c;
  undefined1 local_118 [4];
  int i;
  xmlChar buf [150];
  void *pvStack_70;
  int len;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr cur;
  xmlParserInputPtr input;
  xmlErrorLevel level;
  xmlNodePtr node;
  xmlChar *name;
  char *str;
  void *data;
  int domain;
  int code;
  int line;
  char *file;
  xmlErrorPtr err_local;
  void *ctx_local;
  
  node = (xmlNodePtr)0x0;
  cur = (xmlParserInputPtr)0x0;
  ctxt = (xmlParserCtxtPtr)0x0;
  pvStack_70 = (void *)0x0;
  if (err != (xmlErrorPtr)0x0) {
    uVar1 = err->line;
    iVar2 = err->code;
    iVar8 = err->domain;
    xVar3 = err->level;
    pvVar4 = err->node;
    if ((((iVar8 == 1) || (iVar8 == 5)) || (iVar8 == 4)) ||
       (((iVar8 == 3 || (iVar8 == 8)) || (iVar8 == 0x17)))) {
      pvStack_70 = err->ctxt;
    }
    pcVar5 = err->message;
    if (iVar2 != 0) {
      if ((pvVar4 != (void *)0x0) && (*(int *)((long)pvVar4 + 8) == 1)) {
        node = *(xmlNodePtr *)((long)pvVar4 + 0x10);
      }
      if (pvStack_70 == (void *)0x0) {
        if (err->file == (char *)0x0) {
          if ((uVar1 != 0) && (iVar8 == 1)) {
            channel((void *)0x0,"Entity: line %d: ",(ulong)uVar1);
          }
        }
        else {
          channel((void *)0x0,"%s:%d: ",err->file,(ulong)uVar1);
        }
      }
      else {
        pxVar6 = *(xmlParserCtxtPtr *)((long)pvStack_70 + 0x38);
        cur = (xmlParserInputPtr)pxVar6;
        if (((pxVar6 != (xmlParserCtxtPtr)0x0) && (pxVar6->userData == (void *)0x0)) &&
           (1 < *(int *)((long)pvStack_70 + 0x40))) {
          cur = *(xmlParserInputPtr *)
                 (*(long *)((long)pvStack_70 + 0x48) +
                 (long)(*(int *)((long)pvStack_70 + 0x40) + -2) * 8);
          ctxt = pxVar6;
        }
        if (cur != (xmlParserInputPtr)0x0) {
          if (cur->filename == (char *)0x0) {
            if ((uVar1 != 0) && (iVar8 == 1)) {
              channel((void *)0x0,"Entity: line %d: ",(ulong)(uint)cur->line);
            }
          }
          else {
            channel((void *)0x0,"%s:%d: ",cur->filename,(ulong)(uint)cur->line);
          }
        }
      }
      if (node != (xmlNodePtr)0x0) {
        channel((void *)0x0,"element %s: ",node);
      }
      if (iVar2 != 0) {
        switch(iVar8) {
        case 1:
          channel((void *)0x0,"parser ");
          break;
        default:
          break;
        case 3:
          channel((void *)0x0,"namespace ");
          break;
        case 4:
        case 0x17:
          channel((void *)0x0,"validity ");
          break;
        case 5:
          channel((void *)0x0,"HTML parser ");
          break;
        case 6:
          channel((void *)0x0,"memory ");
          break;
        case 7:
          channel((void *)0x0,"output ");
          break;
        case 8:
          channel((void *)0x0,"I/O ");
          break;
        case 0xb:
          channel((void *)0x0,"XInclude ");
          break;
        case 0xc:
          channel((void *)0x0,"XPath ");
          break;
        case 0xd:
          channel((void *)0x0,"parser ");
          break;
        case 0xe:
          channel((void *)0x0,"regexp ");
          break;
        case 0x10:
          channel((void *)0x0,"Schemas parser ");
          break;
        case 0x11:
          channel((void *)0x0,"Schemas validity ");
          break;
        case 0x12:
          channel((void *)0x0,"Relax-NG parser ");
          break;
        case 0x13:
          channel((void *)0x0,"Relax-NG validity ");
          break;
        case 0x14:
          channel((void *)0x0,"Catalog ");
          break;
        case 0x15:
          channel((void *)0x0,"C14N ");
          break;
        case 0x16:
          channel((void *)0x0,"XSLT ");
          break;
        case 0x1a:
          channel((void *)0x0,"module ");
        }
        if (iVar2 != 0) {
          switch(xVar3) {
          case XML_ERR_NONE:
            channel((void *)0x0,": ");
            break;
          case XML_ERR_WARNING:
            channel((void *)0x0,"warning : ");
            break;
          case XML_ERR_ERROR:
            channel((void *)0x0,"error : ");
            break;
          case XML_ERR_FATAL:
            channel((void *)0x0,"error : ");
          }
          if (iVar2 != 0) {
            if (pcVar5 == (char *)0x0) {
              channel((void *)0x0,"%s\n","out of memory error");
            }
            else {
              iVar7 = xmlStrlen(pcVar5);
              if ((iVar7 < 1) || (pcVar5[iVar7 + -1] == '\n')) {
                channel((void *)0x0,"%s",pcVar5);
              }
              else {
                channel((void *)0x0,"%s\n",pcVar5);
              }
            }
            if (iVar2 != 0) {
              if ((pvStack_70 != (void *)0x0) &&
                 (xmlParserPrintFileContextInternal(cur,channel,(void *)0x0),
                 ctxt != (xmlParserCtxtPtr)0x0)) {
                if (ctxt->userData == (void *)0x0) {
                  if ((uVar1 != 0) && (iVar8 == 1)) {
                    channel((void *)0x0,"Entity: line %d: \n",(ulong)(uint)ctxt->html);
                  }
                }
                else {
                  channel((void *)0x0,"%s:%d: \n",ctxt->userData,(ulong)(uint)ctxt->html);
                }
                xmlParserPrintFileContextInternal((xmlParserInputPtr)ctxt,channel,(void *)0x0);
              }
              if ((((iVar8 == 0xc) && (err->str1 != (char *)0x0)) && (err->int1 < 100)) &&
                 (iVar2 = err->int1, iVar8 = xmlStrlen(err->str1), iVar2 < iVar8)) {
                channel((void *)0x0,"%s\n",err->str1);
                for (local_11c = 0; local_11c < err->int1; local_11c = local_11c + 1) {
                  local_118[local_11c] = 0x20;
                }
                local_118[local_11c] = 0x5e;
                local_118[local_11c + 1] = 0;
                channel((void *)0x0,"%s\n",local_118);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
testStructuredErrorHandler(void *ctx  ATTRIBUTE_UNUSED, xmlErrorPtr err) {
    char *file = NULL;
    int line = 0;
    int code = -1;
    int domain;
    void *data = NULL;
    const char *str;
    const xmlChar *name = NULL;
    xmlNodePtr node;
    xmlErrorLevel level;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;
    xmlParserCtxtPtr ctxt = NULL;

    if (err == NULL)
        return;

    file = err->file;
    line = err->line;
    code = err->code;
    domain = err->domain;
    level = err->level;
    node = err->node;
    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = err->ctxt;
    }
    str = err->message;

    if (code == XML_ERR_OK)
        return;

    if ((node != NULL) && (node->type == XML_ELEMENT_NODE))
        name = node->name;

    /*
     * Maintain the compatibility with the legacy error handling
     */
    if (ctxt != NULL) {
        input = ctxt->input;
        if ((input != NULL) && (input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            cur = input;
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        if (input != NULL) {
            if (input->filename)
                channel(data, "%s:%d: ", input->filename, input->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: ", input->line);
        }
    } else {
        if (file != NULL)
            channel(data, "%s:%d: ", file, line);
        else if ((line != 0) && (domain == XML_FROM_PARSER))
            channel(data, "Entity: line %d: ", line);
    }
    if (name != NULL) {
        channel(data, "element %s: ", name);
    }
    if (code == XML_ERR_OK)
        return;
    switch (domain) {
        case XML_FROM_PARSER:
            channel(data, "parser ");
            break;
        case XML_FROM_NAMESPACE:
            channel(data, "namespace ");
            break;
        case XML_FROM_DTD:
        case XML_FROM_VALID:
            channel(data, "validity ");
            break;
        case XML_FROM_HTML:
            channel(data, "HTML parser ");
            break;
        case XML_FROM_MEMORY:
            channel(data, "memory ");
            break;
        case XML_FROM_OUTPUT:
            channel(data, "output ");
            break;
        case XML_FROM_IO:
            channel(data, "I/O ");
            break;
        case XML_FROM_XINCLUDE:
            channel(data, "XInclude ");
            break;
        case XML_FROM_XPATH:
            channel(data, "XPath ");
            break;
        case XML_FROM_XPOINTER:
            channel(data, "parser ");
            break;
        case XML_FROM_REGEXP:
            channel(data, "regexp ");
            break;
        case XML_FROM_MODULE:
            channel(data, "module ");
            break;
        case XML_FROM_SCHEMASV:
            channel(data, "Schemas validity ");
            break;
        case XML_FROM_SCHEMASP:
            channel(data, "Schemas parser ");
            break;
        case XML_FROM_RELAXNGP:
            channel(data, "Relax-NG parser ");
            break;
        case XML_FROM_RELAXNGV:
            channel(data, "Relax-NG validity ");
            break;
        case XML_FROM_CATALOG:
            channel(data, "Catalog ");
            break;
        case XML_FROM_C14N:
            channel(data, "C14N ");
            break;
        case XML_FROM_XSLT:
            channel(data, "XSLT ");
            break;
        default:
            break;
    }
    if (code == XML_ERR_OK)
        return;
    switch (level) {
        case XML_ERR_NONE:
            channel(data, ": ");
            break;
        case XML_ERR_WARNING:
            channel(data, "warning : ");
            break;
        case XML_ERR_ERROR:
            channel(data, "error : ");
            break;
        case XML_ERR_FATAL:
            channel(data, "error : ");
            break;
    }
    if (code == XML_ERR_OK)
        return;
    if (str != NULL) {
        int len;
	len = xmlStrlen((const xmlChar *)str);
	if ((len > 0) && (str[len - 1] != '\n'))
	    channel(data, "%s\n", str);
	else
	    channel(data, "%s", str);
    } else {
        channel(data, "%s\n", "out of memory error");
    }
    if (code == XML_ERR_OK)
        return;

    if (ctxt != NULL) {
        xmlParserPrintFileContextInternal(input, channel, data);
        if (cur != NULL) {
            if (cur->filename)
                channel(data, "%s:%d: \n", cur->filename, cur->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: \n", cur->line);
            xmlParserPrintFileContextInternal(cur, channel, data);
        }
    }
    if ((domain == XML_FROM_XPATH) && (err->str1 != NULL) &&
        (err->int1 < 100) &&
	(err->int1 < xmlStrlen((const xmlChar *)err->str1))) {
	xmlChar buf[150];
	int i;

	channel(data, "%s\n", err->str1);
	for (i=0;i < err->int1;i++)
	     buf[i] = ' ';
	buf[i++] = '^';
	buf[i] = 0;
	channel(data, "%s\n", buf);
    }
}